

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

ecs_data_t *
ecs_table_merge(ecs_world_t *world,ecs_table_t *new_table,ecs_table_t *old_table,
               ecs_data_t *new_data,ecs_data_t *old_data)

{
  int iVar1;
  int iVar2;
  ecs_column_t *peVar3;
  ecs_vector_t *peVar4;
  ecs_column_t *peVar5;
  ecs_vector_t *peVar6;
  ecs_move_t p_Var7;
  ecs_entity_t eVar8;
  ecs_c_info_t *peVar9;
  int *piVar10;
  ecs_sw_column_t *peVar11;
  short sVar12;
  uint count;
  int32_t new_index;
  int32_t iVar13;
  int32_t count_00;
  void *pvVar14;
  void *pvVar15;
  undefined8 *puVar16;
  ecs_column_t *peVar17;
  ecs_entity_t *entities;
  void *pvVar18;
  void *__src;
  size_t sVar19;
  int16_t iVar20;
  char *pcVar21;
  int16_t extraout_DX;
  int16_t extraout_DX_00;
  int16_t size;
  int16_t size_00;
  int elem_count;
  ecs_column_t *peVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ecs_column_t *column_00;
  ecs_column_t *column;
  bool bVar29;
  ecs_vector_t *local_48;
  int local_3c;
  ecs_entity_t *local_38;
  
  pcVar21 = "old_table != NULL";
  _ecs_assert(old_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"old_table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x7b0);
  if (old_table == (ecs_table_t *)0x0) {
    __assert_fail("old_table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x7b0,
                  "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                 );
  }
  if (new_table == (ecs_table_t *)0x0) {
    ecs_table_clear_data(world,old_table,old_data);
  }
  else if (old_data != (ecs_data_t *)0x0) {
    uVar28 = 0;
    bVar29 = new_data == (ecs_data_t *)0x0;
    if (bVar29) {
      new_data = ecs_table_get_or_create_data(new_table);
    }
    pvVar14 = _ecs_vector_first(old_data->entities,8,0x10);
    count = ecs_vector_count(old_data->entities);
    new_index = ecs_vector_count(new_data->entities);
    pvVar15 = _ecs_vector_first(old_data->record_ptrs,8,0x10);
    uVar24 = 0;
    if (0 < (int)count) {
      uVar24 = (ulong)count;
    }
    for (; iVar20 = (int16_t)pcVar21, uVar24 != uVar28; uVar28 = uVar28 + 1) {
      if (new_table == old_table) {
        puVar16 = (undefined8 *)
                  _ecs_sparse_get_or_create
                            ((world->store).entity_index,0x10,
                             *(uint64_t *)((long)pvVar14 + uVar28 * 8));
      }
      else {
        puVar16 = *(undefined8 **)((long)pvVar15 + uVar28 * 8);
        pcVar21 = "record != NULL";
        _ecs_assert(puVar16 != (undefined8 *)0x0,0xc,(char *)0x0,"record != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                    ,0x7d3);
        if (puVar16 == (undefined8 *)0x0) {
          __assert_fail("record != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                        ,0x7d3,
                        "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                       );
        }
      }
      iVar13 = ecs_row_to_record(new_index + (int)uVar28,
                                 SUB41((uint)*(undefined4 *)(puVar16 + 1) >> 0x1f,0));
      *(int32_t *)(puVar16 + 1) = iVar13;
      *puVar16 = new_table;
    }
    if (bVar29 && new_table == old_table) {
      new_data->bs_columns = old_data->bs_columns;
      peVar4 = old_data->entities;
      peVar6 = old_data->record_ptrs;
      peVar11 = old_data->sw_columns;
      new_data->columns = old_data->columns;
      new_data->sw_columns = peVar11;
      new_data->entities = peVar4;
      new_data->record_ptrs = peVar6;
    }
    else {
      iVar1 = new_table->column_count;
      iVar2 = old_table->column_count;
      pvVar14 = _ecs_vector_first(new_table->type,8,0x10);
      pvVar15 = _ecs_vector_first(old_table->type,8,0x10);
      peVar3 = old_data->columns;
      peVar17 = new_data->columns;
      size = extraout_DX;
      if (peVar17 == (ecs_column_t *)0x0) {
        if (new_data->entities == (ecs_vector_t *)0x0) {
          ecs_init_data(world,new_table,new_data);
          peVar17 = new_data->columns;
          size = extraout_DX_00;
        }
        else {
          peVar17 = (ecs_column_t *)0x0;
        }
      }
      if (count != 0) {
        merge_vector(&new_data->entities,old_data->entities,size,iVar20);
        old_data->entities = (ecs_vector_t *)0x0;
        entities = (ecs_entity_t *)_ecs_vector_first(new_data->entities,8,0x10);
        iVar13 = ecs_vector_count(new_data->entities);
        elem_count = count + new_index;
        iVar20 = -0xec4;
        iVar23 = 0;
        _ecs_assert(iVar13 == elem_count,0xc,(char *)0x0,
                    "ecs_vector_count(new_data->entities) == old_count + new_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                    ,0x725);
        iVar13 = ecs_vector_count(new_data->entities);
        if (iVar13 != elem_count) {
          __assert_fail("ecs_vector_count(new_data->entities) == old_count + new_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                        ,0x725,
                        "void merge_table_data(ecs_world_t *, ecs_table_t *, ecs_table_t *, int32_t, int32_t, ecs_data_t *, ecs_data_t *)"
                       );
        }
        merge_vector(&new_data->record_ptrs,old_data->record_ptrs,size_00,iVar20);
        old_data->record_ptrs = (ecs_vector_t *)0x0;
        iVar26 = 0;
        column_00 = peVar3;
LAB_00123dfc:
        lVar25 = (long)iVar23;
        peVar22 = peVar17 + iVar26;
        do {
          lVar27 = (long)iVar26;
          peVar5 = peVar17 + lVar27;
LAB_00123e3c:
          if (((iVar1 <= iVar26 || iVar2 <= iVar23) ||
              (uVar28 = *(ulong *)((long)pvVar14 + lVar27 * 8), 0xffffffffffffff < uVar28)) ||
             (uVar24 = *(ulong *)((long)pvVar15 + lVar25 * 8), 0xffffffffffffff < uVar24)) {
            move_switch_columns(new_table,new_data,new_index,old_table,old_data,0,count);
            for (; lVar27 < iVar1; lVar27 = lVar27 + 1) {
              if (peVar22->size != 0) {
                sVar12 = peVar22->alignment;
                if (sVar12 < 0x11) {
                  sVar12 = 0x10;
                }
                _ecs_vector_set_count(&peVar22->data,(int)peVar22->size,sVar12,elem_count);
                peVar9 = new_table->c_info[lVar27];
                if ((peVar9 != (ecs_c_info_t *)0x0) && ((peVar9->lifecycle).ctor != (ecs_xtor_t)0x0)
                   ) {
                  ctor_component(world,peVar9,peVar22,entities,0,elem_count);
                }
              }
              peVar22 = peVar22 + 1;
            }
            for (; lVar25 < iVar2; lVar25 = lVar25 + 1) {
              peVar9 = old_table->c_info[lVar25];
              if ((peVar9 != (ecs_c_info_t *)0x0) && ((peVar9->lifecycle).dtor != (ecs_xtor_t)0x0))
              {
                dtor_component(world,peVar9,column_00,entities,0,count);
              }
              ecs_vector_free(column_00->data);
              column_00->data = (ecs_vector_t *)0x0;
              column_00 = column_00 + 1;
            }
            piVar10 = new_table->dirty_state;
            if (piVar10 != (int *)0x0) {
              *piVar10 = *piVar10 + 1;
            }
            break;
          }
          if (uVar28 == uVar24) {
            peVar4 = peVar3[lVar25].data;
            local_3c = iVar26;
            local_38 = (ecs_entity_t *)_ecs_vector_first(new_data->entities,8,0x10);
            peVar9 = new_table->c_info[lVar27];
            peVar5 = new_data->columns;
            peVar22 = peVar5 + lVar27;
            peVar6 = peVar5[lVar27].data;
            iVar26 = (int)peVar5[lVar27].size;
            sVar12 = peVar5[lVar27].alignment;
            local_48 = peVar6;
            iVar13 = ecs_vector_count(peVar6);
            if (iVar13 == 0) {
              if (peVar6 != (ecs_vector_t *)0x0) {
                ecs_vector_free(peVar6);
              }
              peVar22->data = peVar4;
            }
            else {
              count_00 = ecs_vector_count(peVar4);
              iVar20 = 0x10;
              if (0x10 < sVar12) {
                iVar20 = sVar12;
              }
              _ecs_vector_set_count(&local_48,iVar26,iVar20,count_00 + iVar13);
              peVar22->data = local_48;
              if (peVar9 != (ecs_c_info_t *)0x0) {
                ctor_component(world,peVar9,peVar22,local_38,iVar13,count_00);
              }
              pvVar18 = _ecs_vector_first(local_48,iVar26,iVar20);
              __src = _ecs_vector_first(peVar4,iVar26,iVar20);
              pvVar18 = (void *)((long)(iVar13 * iVar26) + (long)pvVar18);
              if ((peVar9 == (ecs_c_info_t *)0x0) ||
                 (p_Var7 = (peVar9->lifecycle).move, p_Var7 == (ecs_move_t)0x0)) {
                memcpy(pvVar18,__src,(long)(count_00 * iVar26));
              }
              else {
                eVar8 = peVar9->component;
                sVar19 = ecs_to_size_t((long)iVar26);
                (*p_Var7)(world,eVar8,local_38,local_38,pvVar18,__src,sVar19,count_00,
                          (peVar9->lifecycle).ctx);
              }
              ecs_vector_free(peVar4);
            }
            peVar3[lVar25].data = (ecs_vector_t *)0x0;
            iVar26 = local_3c + 1;
            if (new_table->dirty_state != (int32_t *)0x0) {
              piVar10 = new_table->dirty_state + iVar26;
              *piVar10 = *piVar10 + 1;
            }
            goto LAB_001241d0;
          }
          sVar12 = peVar5->size;
          if (uVar24 <= uVar28) goto code_r0x00123e6e;
          if (sVar12 != 0) {
            iVar20 = 0x10;
            if (0x10 < peVar5->alignment) {
              iVar20 = peVar5->alignment;
            }
            _ecs_vector_set_count(&peVar5->data,(int)sVar12,iVar20,elem_count);
            peVar9 = new_table->c_info[lVar27];
            if ((peVar9 != (ecs_c_info_t *)0x0) && ((peVar9->lifecycle).ctor != (ecs_xtor_t)0x0)) {
              ctor_component(world,peVar9,peVar5,entities,0,elem_count);
            }
          }
          iVar26 = iVar26 + 1;
          peVar22 = peVar22 + 1;
        } while( true );
      }
    }
    new_table->alloc_count = new_table->alloc_count + 1;
    if (count == 0 || new_index != 0) {
      return new_data;
    }
    ecs_table_activate(world,new_table,(ecs_query_t *)0x0,true);
    return new_data;
  }
  return (ecs_data_t *)0x0;
code_r0x00123e6e:
  if ((uVar24 < uVar28) && (sVar12 != 0)) {
    peVar22 = peVar3 + lVar25;
    peVar9 = old_table->c_info[lVar25];
    if ((peVar9 != (ecs_c_info_t *)0x0) && ((peVar9->lifecycle).dtor != (ecs_xtor_t)0x0)) {
      dtor_component(world,peVar9,peVar22,entities,0,count);
    }
    ecs_vector_free(peVar22->data);
    peVar22->data = (ecs_vector_t *)0x0;
LAB_001241d0:
    iVar23 = iVar23 + 1;
    column_00 = column_00 + 1;
    goto LAB_00123dfc;
  }
  goto LAB_00123e3c;
}

Assistant:

ecs_data_t* ecs_table_merge(
    ecs_world_t * world,
    ecs_table_t *new_table,
    ecs_table_t *old_table,
    ecs_data_t *new_data,
    ecs_data_t *old_data)
{
    ecs_assert(old_table != NULL, ECS_INTERNAL_ERROR, NULL);
    bool move_data = false;
    
    /* If there is nothing to merge to, just clear the old table */
    if (!new_table) {
        ecs_table_clear_data(world, old_table, old_data);
        return NULL;
    }

    /* If there is no data to merge, drop out */
    if (!old_data) {
        return NULL;
    }

    if (!new_data) {
        new_data = ecs_table_get_or_create_data(new_table);
        if (new_table == old_table) {
            move_data = true;
        }
    }

    ecs_entity_t *old_entities = ecs_vector_first(old_data->entities, ecs_entity_t);

    int32_t old_count = ecs_vector_count(old_data->entities);
    int32_t new_count = ecs_vector_count(new_data->entities);

    ecs_record_t **old_records = ecs_vector_first(
        old_data->record_ptrs, ecs_record_t*);

    /* First, update entity index so old entities point to new type */
    int32_t i;
    for(i = 0; i < old_count; i ++) {
        ecs_record_t *record;
        if (new_table != old_table) {
            record = old_records[i];
            ecs_assert(record != NULL, ECS_INTERNAL_ERROR, NULL);
        } else {
            record = ecs_eis_get_or_create(world, old_entities[i]);
        }

        bool is_monitored = record->row < 0;
        record->row = ecs_row_to_record(new_count + i, is_monitored);
        record->table = new_table;
    }

    /* Merge table columns */
    if (move_data) {
        *new_data = *old_data;
    } else {
        merge_table_data(world, new_table, old_table, old_count, new_count, 
            old_data, new_data);
    }

    new_table->alloc_count ++;

    if (!new_count && old_count) {
        ecs_table_activate(world, new_table, NULL, true);
    }

    return new_data;
}